

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppLayout.cpp
# Opt level: O2

bool __thiscall cursespp::AppLayout::KeyPress(AppLayout *this,string *key)

{
  element_type *peVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  long *plVar5;
  AppLayout *pAVar6;
  byte bVar7;
  AppLayout *local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  undefined4 extraout_var;
  
  iVar4 = (*(((this->shortcuts).
              super___shared_ptr<cursespp::ShortcutsWindow,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_Window).super_IWindow.super_IOrderable._vptr_IOrderable[0x24])();
  bVar2 = std::operator==(key,"^[");
  bVar7 = (byte)iVar4;
  if (((bVar2) || (bVar2 = std::operator==(key,"KEY_ENTER"), (bVar7 & bVar2) != 0)) ||
     (bVar2 = std::operator==(key,"KEY_UP"), (bVar2 & bVar7) == 1)) {
    if (bVar7 == 0) {
      FocusShortcuts(this);
    }
    else {
      BlurShortcuts((AppLayout *)&stack0xffffffffffffffc0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc8);
    }
    return true;
  }
  if (bVar7 != 0) {
    bVar2 = std::operator==(key,"KEY_DOWN");
    if (bVar2) {
      return true;
    }
    bVar2 = std::operator==(key,"KEY_LEFT");
    if (bVar2) {
      return true;
    }
    bVar2 = std::operator==(key,"KEY_UP");
    if (bVar2) {
      return true;
    }
    bVar2 = std::operator==(key,"KEY_RIGHT");
    if (bVar2) {
      return true;
    }
  }
  peVar1 = (this->layout).super___shared_ptr<cursespp::LayoutBase,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  iVar4 = (*(peVar1->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable[0x45])
                    (peVar1,key);
  if ((char)iVar4 != '\0') {
    return true;
  }
  (*(((this->layout).super___shared_ptr<cursespp::LayoutBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    super_Window).super_IWindow.super_IOrderable._vptr_IOrderable[0x3a])(&local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
  pAVar6 = local_50;
  while( true ) {
    bVar2 = pAVar6 != this && pAVar6 != (AppLayout *)0x0;
    if (pAVar6 == this || pAVar6 == (AppLayout *)0x0) {
      return bVar2;
    }
    plVar5 = (long *)__dynamic_cast(pAVar6,&IWindow::typeinfo,&IKeyHandler::typeinfo,
                                    0xfffffffffffffffe);
    if ((plVar5 != (long *)0x0) &&
       (cVar3 = (**(code **)(*plVar5 + 0x10))(plVar5,key), cVar3 != '\0')) break;
    iVar4 = (*(pAVar6->super_LayoutBase).super_Window.super_IWindow.super_IOrderable.
              _vptr_IOrderable[0x25])(pAVar6);
    pAVar6 = (AppLayout *)CONCAT44(extraout_var,iVar4);
  }
  return bVar2;
}

Assistant:

bool AppLayout::KeyPress(const std::string& key) {
    /* otherwise, see if the user is monkeying around with the
    shortcut bar focus... */
    const auto shortcutsFocused = this->shortcuts->IsFocused();
    if (key == "^["  ||
        (key == "KEY_ENTER" && shortcutsFocused) ||
        (key == "KEY_UP" && shortcutsFocused))
    {
        if (shortcutsFocused) {
            this->BlurShortcuts();
        }
        else {
            this->FocusShortcuts();
        }
        return true;
    }

    if (shortcutsFocused) {
        if (key == "KEY_DOWN" || key == "KEY_LEFT" ||
            key == "KEY_UP" || key == "KEY_RIGHT")
        {
            /* layouts allow focusing via TAB and sometimes arrow
            keys. suppress these from bubbling. */
            return true;
        }
    }

    /* otherwise, pass along to our child layout */
    if (this->layout->KeyPress(key)) {
        return true;
    }

    /* the child layout didn't handle it directly, so let's walk
    up the parent hierarchy to see if there's someone who can. */
    auto focus = this->layout->GetFocus().get();
    while (focus != nullptr && focus != this) {
        auto asKeyHandler = dynamic_cast<IKeyHandler*>(focus);
        if (asKeyHandler) {
            if (asKeyHandler->KeyPress(key)) {
                return true;
            }
        }
        focus = focus->GetParent();
    }

    return false;
}